

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O1

JsErrorCode
JsTTDGetSnapShotBoundInterval
          (JsRuntimeHandle runtimeHandle,int64_t targetEventTime,int64_t *startSnapTime,
          int64_t *endSnapTime)

{
  JsrtRuntime *runtime;
  
  ThreadContext::ValidateThreadContext(*runtimeHandle);
  if (*(EventLog **)(*runtimeHandle + 0x16b8) != (EventLog *)0x0) {
    TTD::EventLog::GetSnapShotBoundInterval
              (*(EventLog **)(*runtimeHandle + 0x16b8),targetEventTime,startSnapTime,endSnapTime);
    return JsNoError;
  }
  TTDAbort_unrecoverable_error("Should only happen in TT debugging mode.");
}

Assistant:

CHAKRA_API JsTTDGetSnapShotBoundInterval(_In_ JsRuntimeHandle runtimeHandle, _In_ int64_t targetEventTime, _Out_ int64_t* startSnapTime, _Out_ int64_t* endSnapTime)
{
#if !ENABLE_TTD
    return JsErrorCategoryUsage;
#else
    JsrtRuntime* runtime = JsrtRuntime::FromHandle(runtimeHandle);
    ThreadContext* threadContext = runtime->GetThreadContext();
    TTDAssert(threadContext->IsRuntimeInTTDMode(), "Should only happen in TT debugging mode.");

#ifdef __APPLE__
    //TODO: Explicit cast of ptr since compiler gets confused -- resolve in PAL later
    static_assert(sizeof(int64_t) == sizeof(int64), "int64_t and int64 size mis-match");
    threadContext->TTDLog->GetSnapShotBoundInterval(targetEventTime, (int64*)startSnapTime, (int64*)endSnapTime);
#else
    threadContext->TTDLog->GetSnapShotBoundInterval(targetEventTime, startSnapTime, endSnapTime);
#endif

    return JsNoError;
#endif
}